

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::IndirectDispatchBufferStorageTestCase::initTestCaseIteration
          (IndirectDispatchBufferStorageTestCase *this,GLuint sparse_bo)

{
  GLenum GVar1;
  
  this->m_sparse_bo = sparse_bo;
  (*this->m_gl->bindBuffer)(0x8892,sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xb1c);
  (*this->m_gl->bufferPageCommitmentARB)(0x8892,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xb21);
  return true;
}

Assistant:

bool IndirectDispatchBufferStorageTestCase::initTestCaseIteration(glw::GLuint sparse_bo)
{
	bool result = true;

	/* Cache the BO id, if not cached already */
	DE_ASSERT(m_sparse_bo == 0 || m_sparse_bo == sparse_bo);

	m_sparse_bo = sparse_bo;

	/* Set up the sparse bufffer. */
	m_gl.bindBuffer(GL_ARRAY_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0,				 /* offset */
								 m_sparse_bo_size_rounded, GL_TRUE); /* commit */

	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

	return result;
}